

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

uint nullcGetTypeSize(uint typeID)

{
  if (NULLCTypeInfo::linker == 0) {
    __assert_fail("NULLCTypeInfo::linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x1d5,"unsigned int nullcGetTypeSize(unsigned int)");
  }
  if (typeID < *(uint *)(NULLCTypeInfo::linker + 0x20c)) {
    return *(uint *)(*(long *)(NULLCTypeInfo::linker + 0x200) + 4 + (ulong)typeID * 0x50);
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

unsigned int	nullcGetTypeSize(unsigned int typeID)
{
	assert(NULLCTypeInfo::linker);
	return NULLCTypeInfo::linker->exTypes[typeID].size;
}